

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool isItRandom<ThreeWiseHash<unsigned_int,unsigned_char>>(uint L)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  reference pvVar5;
  ulong uVar6;
  void *this;
  uint64 y;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  int k_1;
  uint64 x;
  ThreeWiseHash<unsigned_int,_unsigned_char> base;
  int k;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int n;
  uint L_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"checking that it is randomized ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,5,&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  for (base.hasher.hashvalues[0xfe] = 0;
      (int)base.hasher.hashvalues[0xfe] <
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_;
      base.hasher.hashvalues[0xfe] = base.hasher.hashvalues[0xfe] + 1) {
    vVar1 = (value_type)base.hasher.hashvalues[0xfe];
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                        (long)(int)base.hasher.hashvalues[0xfe]);
    *pvVar5 = vVar1;
  }
  ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash
            ((ThreeWiseHash<unsigned_int,_unsigned_char> *)&x,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,L);
  uVar2 = ThreeWiseHash<unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((ThreeWiseHash<unsigned_int,unsigned_char> *)&x,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  for (hf.hasher.hashvalues[0xff] = 0; (int)hf.hasher.hashvalues[0xff] < 100;
      hf.hasher.hashvalues[0xff] = hf.hasher.hashvalues[0xff] + 1) {
    ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash
              ((ThreeWiseHash<unsigned_int,_unsigned_char> *)&y,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,L);
    uVar3 = ThreeWiseHash<unsigned_int,unsigned_char>::
            hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((ThreeWiseHash<unsigned_int,unsigned_char> *)&y,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    uVar6 = (ulong)uVar3;
    if (uVar6 == uVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"collision ");
      this = (void *)std::ostream::operator<<(poVar4,uVar6);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"It is randomized! ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      n._3_1_ = 1;
    }
    ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash
              ((ThreeWiseHash<unsigned_int,_unsigned_char> *)&y);
    if (uVar6 != uVar2) goto LAB_0010724e;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Not randomized! ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  n._3_1_ = 0;
LAB_0010724e:
  ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash
            ((ThreeWiseHash<unsigned_int,_unsigned_char> *)&x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (bool)(n._3_1_ & 1);
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}